

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,prevector<8u,int,unsigned_int,int>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          prevector<8U,_int,_unsigned_int,_int> *v)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = v->_size;
  uVar1 = uVar2 - 9;
  if (uVar2 < 9) {
    uVar1 = uVar2;
  }
  WriteCompactSize<DataStream>(s,(ulong)uVar1);
  uVar2 = v->_size;
  if (8 < uVar2) {
    v = (prevector<8U,_int,_unsigned_int,_int> *)(v->_union).indirect_contents.indirect;
    uVar2 = uVar2 - 9;
  }
  if (uVar2 != 0) {
    lVar3 = 0;
    do {
      local_3c = *(undefined4 *)((long)&v->_union + lVar3);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_3c,&local_38);
      lVar3 = lVar3 + 4;
    } while ((long)(int)uVar2 * 4 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }